

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::setCapacity
          (Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this,
          size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> newBuilder;
  size_t newSize_local;
  Vector<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)
           ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
           size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
              *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>>
                     (&this->builder);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
  addAll<kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>>
            ((ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
              *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>>
                     ((ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                       *)local_38);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::operator=
            (&this->builder,pAVar2);
  ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>::
  ~ArrayBuilder((ArrayBuilder<capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage>
                 *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }